

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

TablePrinter * Catch::operator<<(TablePrinter *tp,Duration *value)

{
  Duration *value_local;
  TablePrinter *tp_local;
  
  ReusableStringStream::operator<<(&tp->m_oss,value);
  return tp;
}

Assistant:

TablePrinter& operator << (TablePrinter& tp, T const& value) {
        tp.m_oss << value;
        return tp;
    }